

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::TransformFeedback::FunctionalTest::iterate(FunctionalTest *this)

{
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar3;
  ContextInfo *this_00;
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  FunctionalTest *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || (bVar2)) {
    prepareFunctionPointers(this);
    prepareTransformFeedback(this);
    prepareBuffer(this);
    prepareProgram(this);
    prepareVertexArrayObject(this);
    bVar1 = draw(this);
    bVar2 = verifyBufferContent(this);
    clean(this);
    if (bVar1 && bVar2) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest::iterate()
{
	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		prepareFunctionPointers();
		prepareTransformFeedback();
		prepareBuffer();
		prepareProgram();
		prepareVertexArrayObject();

		is_ok &= draw();
		is_ok &= verifyBufferContent();
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Releasing GL objects. */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}